

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void remove_option(mtree_option **global,char *value,size_t len)

{
  int iVar1;
  mtree_option *local_30;
  mtree_option *last;
  mtree_option *iter;
  size_t len_local;
  char *value_local;
  mtree_option **global_local;
  
  local_30 = (mtree_option *)0x0;
  last = *global;
  while ((last != (mtree_option *)0x0 &&
         ((iVar1 = strncmp(last->value,value,len), iVar1 != 0 ||
          ((last->value[len] != '\0' && (last->value[len] != '='))))))) {
    local_30 = last;
    last = last->next;
  }
  if (last != (mtree_option *)0x0) {
    if (local_30 == (mtree_option *)0x0) {
      *global = last->next;
    }
    else {
      local_30->next = last->next;
    }
    free(last->value);
    free(last);
  }
  return;
}

Assistant:

static void
remove_option(struct mtree_option **global, const char *value, size_t len)
{
	struct mtree_option *iter, *last;

	last = NULL;
	for (iter = *global; iter != NULL; last = iter, iter = iter->next) {
		if (strncmp(iter->value, value, len) == 0 &&
		    (iter->value[len] == '\0' ||
		     iter->value[len] == '='))
			break;
	}
	if (iter == NULL)
		return;
	if (last == NULL)
		*global = iter->next;
	else
		last->next = iter->next;

	free(iter->value);
	free(iter);
}